

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O1

void Bmc_ManBCorePerform(Gia_Man_t *p,Bmc_BCorePar_t *pPars)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  clock_t cVar6;
  sat_solver *s;
  Vec_Int_t *vVarMap;
  Vec_Int_t *__ptr;
  clock_t cVar7;
  Sto_Man_t *pCnf;
  Intp_Man_t *p_00;
  void *vCore0;
  FILE *__stream;
  long lVar8;
  abctime aVar9;
  char *__s;
  timespec ts;
  timespec local_40;
  
  cVar6 = clock();
  s = sat_solver_new();
  sat_solver_store_alloc(s);
  sat_solver_setnvars(s,1000);
  iVar4 = pPars->nTimeOut;
  if ((long)iVar4 == 0) {
    aVar9 = 0;
  }
  else {
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    aVar9 = lVar8 + (long)iVar4 * 1000000;
  }
  s->nRuntimeLimit = aVar9;
  vVarMap = Bmc_ManBCoreCollect(p,pPars->iFrame,pPars->iOutput,s);
  sat_solver_store_mark_roots(s);
  if (pPars->pFilePivots != (char *)0x0) {
    __ptr = Bmc_ManBCoreCollectPivots(p,pPars->pFilePivots,vVarMap);
    piVar2 = __ptr->pArray;
    iVar4 = __ptr->nSize;
    (s->pivot_vars).cap = iVar4;
    (s->pivot_vars).size = iVar4;
    (s->pivot_vars).ptr = piVar2;
    __ptr->nCap = 0;
    __ptr->nSize = 0;
    __ptr->pArray = (int *)0x0;
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
  }
  iVar4 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
  if (iVar4 == 1) {
    if (vVarMap->pArray != (int *)0x0) {
      free(vVarMap->pArray);
      vVarMap->pArray = (int *)0x0;
    }
    if (vVarMap != (Vec_Int_t *)0x0) {
      free(vVarMap);
    }
    sat_solver_delete(s);
    __s = "The BMC problem is SAT.";
  }
  else {
    if (iVar4 != 0) {
      if (pPars->fVerbose != 0) {
        iVar3 = 0x9f6fdd;
        printf("SAT solver returned UNSAT after %7d conflicts.      ",
               (ulong)(uint)(s->stats).conflicts);
        cVar7 = clock();
        Abc_Print(iVar3,"%s =","Time");
        Abc_Print(iVar3,"%9.2f sec\n",SUB84((double)(cVar7 - cVar6) / 1000000.0,0));
      }
      if (iVar4 == -1) {
        pCnf = (Sto_Man_t *)sat_solver_store_release(s);
        cVar6 = clock();
        p_00 = Intp_ManAlloc();
        vCore0 = Intp_ManUnsatCore(p_00,pCnf,1,pPars->fVerbose);
        Intp_ManFree(p_00);
        if (pPars->fVerbose != 0) {
          uVar1 = *(uint *)((long)vCore0 + 4);
          uVar5 = sat_solver_nconflicts(s);
          iVar4 = 0x9f704a;
          printf("UNSAT core contains %d (out of %d) learned clauses.   ",(ulong)uVar1,(ulong)uVar5)
          ;
          cVar7 = clock();
          Abc_Print(iVar4,"%s =","Time");
          Abc_Print(iVar4,"%9.2f sec\n",SUB84((double)(cVar7 - cVar6) / 1000000.0,0));
        }
        qsort(*(void **)((long)vCore0 + 8),(long)*(int *)((long)vCore0 + 4),4,Vec_IntSortCompare1);
        __stream = _stdout;
        if (pPars->pFileProof != (char *)0x0) {
          __stream = fopen(pPars->pFileProof,"wb");
        }
        Intp_ManUnsatCorePrintForBmc((FILE *)__stream,pCnf,vCore0,vVarMap);
        if (__stream != _stdout) {
          fclose(__stream);
        }
        Sto_ManFree(pCnf);
        if (vVarMap->pArray != (int *)0x0) {
          free(vVarMap->pArray);
          vVarMap->pArray = (int *)0x0;
        }
        if (vVarMap != (Vec_Int_t *)0x0) {
          free(vVarMap);
        }
        if (*(void **)((long)vCore0 + 8) != (void *)0x0) {
          free(*(void **)((long)vCore0 + 8));
          *(undefined8 *)((long)vCore0 + 8) = 0;
        }
        if (vCore0 != (void *)0x0) {
          free(vCore0);
        }
        sat_solver_delete(s);
        return;
      }
      __assert_fail("RetValue == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                    ,0xf1,"void Bmc_ManBCorePerform(Gia_Man_t *, Bmc_BCorePar_t *)");
    }
    if (vVarMap->pArray != (int *)0x0) {
      free(vVarMap->pArray);
      vVarMap->pArray = (int *)0x0;
    }
    if (vVarMap != (Vec_Int_t *)0x0) {
      free(vVarMap);
    }
    sat_solver_delete(s);
    __s = "Timeout of conflict limit is reached.";
  }
  puts(__s);
  return;
}

Assistant:

void Bmc_ManBCorePerform( Gia_Man_t * p, Bmc_BCorePar_t * pPars )
{
    clock_t clk = clock();
    Intp_Man_t * pManProof;
    Vec_Int_t * vVarMap, * vCore;
    sat_solver * pSat;
    FILE * pFile;
    void * pSatCnf; 
    int RetValue;
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_store_alloc( pSat ); 
    sat_solver_setnvars( pSat, 1000 );
    sat_solver_set_runtime_limit( pSat, pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    vVarMap = Bmc_ManBCoreCollect( p, pPars->iFrame, pPars->iOutput, pSat );
    sat_solver_store_mark_roots( pSat ); 
    // create pivot variables
    if ( pPars->pFilePivots )
    {
        Vec_Int_t * vPivots = Bmc_ManBCoreCollectPivots(p, pPars->pFilePivots, vVarMap);
        sat_solver_set_pivot_variables( pSat, Vec_IntArray(vPivots), Vec_IntSize(vPivots) );
        Vec_IntReleaseArray( vPivots );
        Vec_IntFree( vPivots );
    }
    // solve the problem
    RetValue = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_Undef )
    {
        Vec_IntFree( vVarMap );
        sat_solver_delete( pSat );
        printf( "Timeout of conflict limit is reached.\n" );
        return;
    }
    if ( RetValue == l_True )
    {
        Vec_IntFree( vVarMap );
        sat_solver_delete( pSat );
        printf( "The BMC problem is SAT.\n" );
        return;
    }
    if ( pPars->fVerbose )
    {
        printf( "SAT solver returned UNSAT after %7d conflicts.      ", (int)pSat->stats.conflicts );
        Abc_PrintTime( 1, "Time", clock() - clk );
    }
    assert( RetValue == l_False );
    pSatCnf = sat_solver_store_release( pSat ); 
//    Sto_ManDumpClauses( (Sto_Man_t *)pSatCnf, "cnf_store.txt" );
    // derive the UNSAT core
    clk = clock();
    pManProof = Intp_ManAlloc();
    vCore = (Vec_Int_t *)Intp_ManUnsatCore( pManProof, (Sto_Man_t *)pSatCnf, 1, pPars->fVerbose );
    Intp_ManFree( pManProof );
    if ( pPars->fVerbose )
    {
        printf( "UNSAT core contains %d (out of %d) learned clauses.   ", Vec_IntSize(vCore), sat_solver_nconflicts(pSat) );
        Abc_PrintTime( 1, "Time", clock() - clk );
    }
    // write the problem
    Vec_IntSort( vCore, 0 );
    pFile = pPars->pFileProof ? fopen( pPars->pFileProof, "wb" ) : stdout;
    Intp_ManUnsatCorePrintForBmc( pFile, (Sto_Man_t *)pSatCnf, vCore, vVarMap );
    if ( pFile != stdout )
        fclose( pFile );
    // cleanup
    Sto_ManFree( (Sto_Man_t *)pSatCnf );
    Vec_IntFree( vVarMap );
    Vec_IntFree( vCore );
    sat_solver_delete( pSat );
}